

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::cmState(cmState *this)

{
  cmCacheManager *this_00;
  cmGlobVerificationManager *this_01;
  cmState *this_local;
  
  std::
  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::map(&this->PropertyDefinitions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->EnabledLanguages);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  ::map(&this->BuiltinCommands);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  ::map(&this->ScriptedCommands);
  cmPropertyMap::cmPropertyMap(&this->GlobalProperties);
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::cmLinkedTree
            (&this->BuildsystemDirectory);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  cmLinkedTree(&this->ExecutionListFiles);
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::cmLinkedTree(&this->PolicyStack);
  cmLinkedTree<cmStateDetail::SnapshotDataType>::cmLinkedTree(&this->SnapshotData);
  cmLinkedTree<cmDefinitions>::cmLinkedTree(&this->VarTree);
  std::__cxx11::string::string((string *)&this->SourceDirectory);
  std::__cxx11::string::string((string *)&this->BinaryDirectory);
  this->IsInTryCompile = false;
  this->IsGeneratorMultiConfig = false;
  this->WindowsShell = false;
  this->WindowsVSIDE = false;
  this->GhsMultiIDE = false;
  this->WatcomWMake = false;
  this->MinGWMake = false;
  this->NMake = false;
  this->MSYSShell = false;
  this->CurrentMode = Unknown;
  this_00 = (cmCacheManager *)operator_new(0x38);
  cmCacheManager::cmCacheManager(this_00);
  this->CacheManager = this_00;
  this_01 = (cmGlobVerificationManager *)operator_new(0x70);
  cmGlobVerificationManager::cmGlobVerificationManager(this_01);
  this->GlobVerificationManager = this_01;
  return;
}

Assistant:

cmState::cmState()
{
  this->CacheManager = new cmCacheManager;
  this->GlobVerificationManager = new cmGlobVerificationManager;
}